

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestP4.cxx
# Opt level: O0

User * __thiscall
cmCTestP4::GetUserData(User *__return_storage_ptr__,cmCTestP4 *this,string *username)

{
  bool bVar1;
  char **cmd;
  pointer ppVar2;
  _Self local_1e8;
  _Base_ptr local_1e0;
  undefined1 local_1d8 [8];
  OutputLogger err;
  UserParser out;
  value_type local_78;
  char *local_70;
  char *local_68;
  char *local_60 [3];
  undefined1 local_48 [8];
  vector<const_char_*,_std::allocator<const_char_*>_> p4_users;
  _Self local_28;
  iterator it;
  string *username_local;
  cmCTestP4 *this_local;
  
  it._M_node = (_Base_ptr)username;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
       ::find(&this->Users,username);
  p4_users.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
                ::end(&this->Users);
  bVar1 = std::operator==(&local_28,
                          (_Self *)&p4_users.
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar1) {
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
    SetP4Options(this,(vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
    local_60[0] = "users";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,local_60);
    local_68 = "-m";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_68);
    local_70 = "1";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_70);
    local_78 = (value_type)std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,&local_78);
    out.P4 = (cmCTestP4 *)0x0;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48,(value_type *)&out.P4
              );
    UserParser::UserParser((UserParser *)&err.super_LineParser.Separator,this,"users-out> ");
    cmProcessTools::OutputLogger::OutputLogger
              ((OutputLogger *)local_1d8,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
               "users-err> ");
    cmd = std::vector<const_char_*,_std::allocator<const_char_*>_>::data
                    ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
    cmCTestVC::RunChild((cmCTestVC *)this,cmd,(OutputParser *)&err.super_LineParser.Separator,
                        (OutputParser *)local_1d8,(char *)0x0,Auto);
    local_1e0 = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
                ::find(&this->Users,it._M_node);
    local_28._M_node = local_1e0;
    local_1e8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>_>
         ::end(&this->Users);
    bVar1 = std::operator==(&local_28,&local_1e8);
    if (bVar1) {
      memset(__return_storage_ptr__,0,0x80);
      User::User(__return_storage_ptr__);
    }
    cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_1d8);
    UserParser::~UserParser((UserParser *)&err.super_LineParser.Separator);
    std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)local_48);
    if (bVar1) {
      return __return_storage_ptr__;
    }
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestP4::User>_>
           ::operator->(&local_28);
  User::User(__return_storage_ptr__,&ppVar2->second);
  return __return_storage_ptr__;
}

Assistant:

cmCTestP4::User cmCTestP4::GetUserData(const std::string& username)
{
  auto it = this->Users.find(username);

  if (it == this->Users.end()) {
    std::vector<char const*> p4_users;
    this->SetP4Options(p4_users);
    p4_users.push_back("users");
    p4_users.push_back("-m");
    p4_users.push_back("1");
    p4_users.push_back(username.c_str());
    p4_users.push_back(nullptr);

    UserParser out(this, "users-out> ");
    OutputLogger err(this->Log, "users-err> ");
    this->RunChild(p4_users.data(), &out, &err);

    // The user should now be added to the map. Search again.
    it = this->Users.find(username);
    if (it == this->Users.end()) {
      return cmCTestP4::User();
    }
  }

  return it->second;
}